

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O2

bool google::sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
               (StringIO *fp,unsigned_long value,size_t length)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  uchar byte;
  size_t local_38;
  
  lVar4 = length * 8;
  lVar1 = 0;
  local_38 = length;
  do {
    lVar3 = lVar1;
    lVar4 = lVar4 + -8;
    if (-lVar3 == length) break;
    byte = (uchar)(value >> ((byte)lVar4 & 0x3f));
    if (7 < (length - 1) + lVar3) {
      byte = '\0';
    }
    bVar2 = write_data<StringIO>(fp,&byte,1);
    lVar1 = lVar3 + -1;
  } while (bVar2);
  return local_38 <= (ulong)-lVar3;
}

Assistant:

bool write_bigendian_number(OUTPUT* fp, IntType value, size_t length) {
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    byte = (sizeof(value) <= length - 1 - i)
               ? 0
               : static_cast<unsigned char>((value >> ((length - 1 - i) * 8)) &
                                            255);
    if (!write_data(fp, &byte, sizeof(byte))) return false;
  }
  return true;
}